

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_reference_expression.cpp
# Opt level: O3

string * __thiscall
duckdb::BoundReferenceExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundReferenceExpression *this)

{
  size_type sVar1;
  pointer pcVar2;
  ulong __val;
  bool bVar3;
  long lVar4;
  char cVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  char cVar9;
  string __str;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  sVar1 = (this->super_Expression).super_BaseExpression.alias._M_string_length;
  if (sVar1 == 0) {
    __val = this->index;
    cVar9 = '\x01';
    if (9 < __val) {
      uVar7 = __val;
      cVar5 = '\x04';
      do {
        cVar9 = cVar5;
        if (uVar7 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_00d6138c;
        }
        if (uVar7 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_00d6138c;
        }
        if (uVar7 < 10000) goto LAB_00d6138c;
        bVar3 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar5 = cVar9 + '\x04';
      } while (bVar3);
      cVar9 = cVar9 + '\x01';
    }
LAB_00d6138c:
    local_40 = local_30;
    ::std::__cxx11::string::_M_construct((ulong)&local_40,cVar9);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(local_40,local_38,__val);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1ecb7ca);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundReferenceExpression::ToString() const {
#ifdef DEBUG
	if (DBConfigOptions::debug_print_bindings) {
		return "#" + to_string(index);
	}
#endif
	if (!alias.empty()) {
		return alias;
	}
	return "#" + to_string(index);
}